

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  pointer puVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmListFileBacktrace backtrace;
  cmListFileBacktrace backtrace_00;
  TargetType TVar4;
  cmValue cVar5;
  string *psVar6;
  pointer puVar7;
  string destination;
  cmInstallScriptGenerator g;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe00;
  string local_1f8;
  ostream *local_1d8;
  string *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  cmLocalGenerator *local_1c0;
  string local_1b8;
  string local_198;
  undefined1 local_178 [40];
  cmInstallTargetGenerator local_150;
  
  puVar7 = (this->GeneratorTargets).
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->GeneratorTargets).
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    local_1d8 = os;
    local_1d0 = config;
    local_1c8 = configurationTypes;
    local_1c0 = this;
    do {
      TVar4 = cmGeneratorTarget::GetType
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar4 != INTERFACE_LIBRARY) {
        pcVar2 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
        local_150.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)
             &local_150.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
              _M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"PRE_INSTALL_SCRIPT","");
        cVar5 = cmGeneratorTarget::GetProperty(pcVar2,(string *)&local_150);
        if (local_150.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)
            &local_150.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
             _M_string_length) {
          operator_delete(local_150.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_150.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (cVar5.Value != (string *)0x0) {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          pcVar3 = ((cVar5.Value)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,pcVar3,pcVar3 + (cVar5.Value)->_M_string_length);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          local_178._16_8_ = 0;
          local_178._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_178 + 0x10));
          backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = in_stack_fffffffffffffe00._M_pi;
          backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)(local_178 + 0x10);
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_150,&local_198,false,&local_1f8,false,false,
                     backtrace);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._24_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_150,local_1d8,local_1d0,local_1c8)
          ;
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_150);
        }
        psVar6 = cmTarget::GetInstallPath_abi_cxx11_
                           (((puVar7->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                            Target);
        if (psVar6->_M_string_length != 0) {
          psVar6 = cmTarget::GetInstallPath_abi_cxx11_
                             (((puVar7->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                              Target);
          std::__cxx11::string::substr((ulong)&local_1f8,(ulong)psVar6);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_1f8);
          if (local_1f8._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)0x0,0x8a5422);
          }
          TVar4 = cmGeneratorTarget::GetType
                            ((puVar7->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (TVar4 < SHARED_LIBRARY) {
LAB_002cf0f9:
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((puVar7->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                      ((cmInstallTargetGeneratorLocal *)&local_150,local_1c0,psVar6,&local_1f8,false
                      );
            cmScriptGenerator::Generate
                      ((cmScriptGenerator *)&local_150,local_1d8,local_1d0,local_1c8);
LAB_002cf165:
            cmInstallTargetGenerator::~cmInstallTargetGenerator(&local_150);
          }
          else {
            if (TVar4 == SHARED_LIBRARY) {
              psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((puVar7->_M_t).
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
              cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                        ((cmInstallTargetGeneratorLocal *)&local_150,local_1c0,psVar6,&local_1f8,
                         false);
              cmScriptGenerator::Generate
                        ((cmScriptGenerator *)&local_150,local_1d8,local_1d0,local_1c8);
              goto LAB_002cf165;
            }
            if (TVar4 == MODULE_LIBRARY) goto LAB_002cf0f9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar2 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
        local_150.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)
             &local_150.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
              _M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"POST_INSTALL_SCRIPT","");
        cVar5 = cmGeneratorTarget::GetProperty(pcVar2,(string *)&local_150);
        if (local_150.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)
            &local_150.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
             _M_string_length) {
          operator_delete(local_150.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_150.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (cVar5.Value != (string *)0x0) {
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          pcVar3 = ((cVar5.Value)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,pcVar3,pcVar3 + (cVar5.Value)->_M_string_length);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          local_178._0_8_ = (pointer)0x0;
          local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_178);
          backtrace_00.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = in_stack_fffffffffffffe00._M_pi;
          backtrace_00.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_178;
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_150,&local_1b8,false,&local_1f8,false,false,
                     backtrace_00);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_150,local_1d8,local_1d0,local_1c8)
          ;
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_150);
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const auto& tgts = this->GetGeneratorTargets();
  for (const auto& l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (cmValue preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*preinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(), destination,
                                           true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(), destination,
                                           false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (cmValue postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*postinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}